

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

TextureGatherCase *
deqp::gles31::Functional::anon_unknown_0::makeTextureGatherCase
          (TextureType textureType,Context *context,char *name,char *description,
          GatherType gatherType,OffsetSize offsetSize,TextureFormat textureFormat,
          CompareMode shadowCompareMode,WrapMode wrapS,WrapMode wrapT,
          MaybeTextureSwizzle *texSwizzle,FilterMode minFilter,FilterMode magFilter,int baseLevel,
          IVec3 *textureSize,deUint32 flags)

{
  OffsetSize offsetSize_00;
  GatherType gatherType_00;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int textureSize_00;
  TextureGatherCubeCase *pTVar4;
  undefined1 local_70 [16];
  OffsetSize local_60;
  GatherType local_5c;
  OffsetSize offsetSize_local;
  GatherType gatherType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureGatherCubeCase *pTStack_38;
  TextureType textureType_local;
  
  local_60 = offsetSize;
  local_5c = gatherType;
  _offsetSize_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local._4_4_ = textureType;
  if (textureType == TEXTURETYPE_2D) {
    pTVar4 = (TextureGatherCubeCase *)operator_new(0x180);
    pcVar3 = name_local;
    pcVar2 = description_local;
    pcVar1 = _offsetSize_local;
    gatherType_00 = local_5c;
    offsetSize_00 = local_60;
    local_70._8_8_ = textureFormat;
    tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_70,(int)textureSize,0);
    TextureGather2DCase::TextureGather2DCase
              ((TextureGather2DCase *)pTVar4,(Context *)pcVar3,pcVar2,pcVar1,gatherType_00,
               offsetSize_00,(TextureFormat)local_70._8_8_,shadowCompareMode,wrapS,wrapT,texSwizzle,
               minFilter,magFilter,baseLevel,flags,(IVec2 *)local_70);
    pTStack_38 = pTVar4;
  }
  else if (textureType == TEXTURETYPE_CUBE) {
    pTVar4 = (TextureGatherCubeCase *)operator_new(0x298);
    pcVar3 = name_local;
    pcVar2 = description_local;
    pcVar1 = _offsetSize_local;
    textureSize_00 = tcu::Vector<int,_3>::x(textureSize);
    TextureGatherCubeCase::TextureGatherCubeCase
              (pTVar4,(Context *)pcVar3,pcVar2,pcVar1,textureFormat,shadowCompareMode,wrapS,wrapT,
               texSwizzle,minFilter,magFilter,baseLevel,flags,textureSize_00);
    pTStack_38 = pTVar4;
  }
  else if (textureType == TEXTURETYPE_2D_ARRAY) {
    pTVar4 = (TextureGatherCubeCase *)operator_new(400);
    TextureGather2DArrayCase::TextureGather2DArrayCase
              ((TextureGather2DArrayCase *)pTVar4,(Context *)name_local,description_local,
               _offsetSize_local,local_5c,local_60,textureFormat,shadowCompareMode,wrapS,wrapT,
               texSwizzle,minFilter,magFilter,baseLevel,flags,textureSize);
    pTStack_38 = pTVar4;
  }
  else {
    pTStack_38 = (TextureGatherCubeCase *)0x0;
  }
  return &pTStack_38->super_TextureGatherCase;
}

Assistant:

static inline TextureGatherCase* makeTextureGatherCase (TextureType					textureType,
														Context&					context,
														const char*					name,
														const char*					description,
														GatherType					gatherType,
														OffsetSize					offsetSize,
														tcu::TextureFormat			textureFormat,
														tcu::Sampler::CompareMode	shadowCompareMode,
														tcu::Sampler::WrapMode		wrapS,
														tcu::Sampler::WrapMode		wrapT,
														const MaybeTextureSwizzle&	texSwizzle,
														tcu::Sampler::FilterMode	minFilter,
														tcu::Sampler::FilterMode	magFilter,
														int							baseLevel,
														const IVec3&				textureSize,
														deUint32					flags = 0)
{
	switch (textureType)
	{
		case TEXTURETYPE_2D:
			return new TextureGather2DCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
										   wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.swizzle(0, 1));

		case TEXTURETYPE_2D_ARRAY:
			return new TextureGather2DArrayCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
												wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize);

		case TEXTURETYPE_CUBE:
			DE_ASSERT(gatherType == GATHERTYPE_BASIC);
			DE_ASSERT(offsetSize == OFFSETSIZE_NONE);
			return new TextureGatherCubeCase(context, name, description, textureFormat, shadowCompareMode,
											 wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.x());

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}